

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

void * dlrealloc_in_place(void *oldmem,size_t bytes)

{
  int *piVar1;
  mstate pmVar2;
  int in_ECX;
  mchunkptr p;
  
  if (oldmem != (void *)0x0) {
    if (bytes < 0xffffffffffffff80) {
      p = (mchunkptr)&DAT_00000020;
      if (0x16 < bytes) {
        p = (mchunkptr)(bytes + 0x17 & 0xfffffffffffffff0);
      }
      pmVar2 = (mstate)try_realloc_chunk((mstate)((long)oldmem + -0x10),p,0,in_ECX);
      if (pmVar2 != (mstate)((long)oldmem + -0x10)) {
        return (void *)0x0;
      }
      return oldmem;
    }
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* dlrealloc_in_place(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = gm;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}